

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

void __thiscall
helics::FilterFederate::runCloningDestinationFilters
          (FilterFederate *this,FilterCoordinator *fcoord,BasicHandleInfo *handle,
          ActionMessage *command)

{
  GlobalFederateId fed;
  element_type *peVar1;
  Message *pMVar2;
  size_t __n;
  pointer puVar3;
  int iVar4;
  FilterInfo *pFVar5;
  pointer ppFVar6;
  pointer puVar7;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  ActionMessage cmd;
  _Head_base<0UL,_helics::Message_*,_false> local_140;
  _Head_base<0UL,_helics::Message_*,_false> local_138;
  Message *local_130;
  ActionMessage *local_128;
  _Any_data *local_120;
  _Any_data *local_118;
  _Any_data *local_110;
  pointer local_108;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_100;
  undefined1 local_e8 [184];
  
  (this->mCoord).triggered = true;
  ppFVar6 = (fcoord->cloningDestFilters).
            super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_108 = (fcoord->cloningDestFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar6 != local_108) {
    local_120 = (_Any_data *)&this->mSendMessage;
    local_110 = (_Any_data *)&this->mDeliverMessage;
    local_118 = (_Any_data *)&this->mSendMessageMove;
    local_128 = command;
    do {
      pFVar5 = *ppFVar6;
      if ((pFVar5->flags & 0x1000) == 0) {
        fed.gid = (this->mFedID).gid;
        if (((GlobalFederateId *)&pFVar5->core_id)->gid == fed.gid) {
          pFVar5 = getFilterInfo(this,fed,(InterfaceHandle)(pFVar5->handle).hid);
          if ((pFVar5 != (FilterInfo *)0x0) &&
             (peVar1 = (pFVar5->filterOp).
                       super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             , peVar1 != (element_type *)0x0)) {
            createMessageFromCommand((helics *)&local_130,local_128);
            (*peVar1->_vptr_FilterOperator[3])(&local_100,peVar1,(helics *)&local_130);
            if (local_130 != (Message *)0x0) {
              CLI::std::default_delete<helics::Message>::operator()
                        ((default_delete<helics::Message> *)&local_130,local_130);
            }
            puVar3 = local_100.
                     super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_130 = (Message *)0x0;
            for (puVar7 = local_100.
                          super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3;
                puVar7 = puVar7 + 1) {
              pMVar2 = (puVar7->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
              if (pMVar2 != (Message *)0x0) {
                __n = (pMVar2->dest)._M_string_length;
                if (__n == (handle->key)._M_string_length) {
                  if (__n != 0) {
                    iVar4 = bcmp((pMVar2->dest)._M_dataplus._M_p,(handle->key)._M_dataplus._M_p,__n)
                    ;
                    if (iVar4 != 0) goto LAB_00313efc;
                  }
                  local_138._M_head_impl =
                       (puVar7->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
                  (puVar7->_M_t).
                  super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
                  .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
                  ActionMessage::ActionMessage
                            ((ActionMessage *)local_e8,
                             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                             &local_138);
                  if (local_138._M_head_impl != (Message *)0x0) {
                    CLI::std::default_delete<helics::Message>::operator()
                              ((default_delete<helics::Message> *)&local_138,local_138._M_head_impl)
                    ;
                  }
                  local_138._M_head_impl = (Message *)0x0;
                  local_e8._16_8_ = handle->handle;
                  if ((this->mSendMessageMove).super__Function_base._M_manager == (_Manager_type)0x0
                     ) {
                    std::__throw_bad_function_call();
                  }
                  (*(this->mSendMessageMove)._M_invoker)(local_118,(ActionMessage *)local_e8);
                }
                else {
LAB_00313efc:
                  local_140._M_head_impl =
                       (puVar7->_M_t).
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
                  (puVar7->_M_t).
                  super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
                  .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
                  ActionMessage::ActionMessage
                            ((ActionMessage *)local_e8,
                             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                             &local_140);
                  if (local_140._M_head_impl != (Message *)0x0) {
                    CLI::std::default_delete<helics::Message>::operator()
                              ((default_delete<helics::Message> *)&local_140,local_140._M_head_impl)
                    ;
                  }
                  local_140._M_head_impl = (Message *)0x0;
                  if ((this->mDeliverMessage).super__Function_base._M_manager == (_Manager_type)0x0)
                  {
                    std::__throw_bad_function_call();
                  }
                  (*(this->mDeliverMessage)._M_invoker)(local_110,(ActionMessage *)local_e8);
                }
                ActionMessage::~ActionMessage((ActionMessage *)local_e8);
              }
            }
            std::
            vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            ::~vector(&local_100);
          }
        }
        else {
          ActionMessage::ActionMessage((ActionMessage *)local_e8,local_128);
          ActionMessage::setAction((ActionMessage *)local_e8,cmd_send_for_filter);
          local_e8._16_4_ = (pFVar5->core_id).gid;
          local_e8._20_4_ = (pFVar5->handle).hid;
          if ((this->mSendMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->mSendMessage)._M_invoker)(local_120,(ActionMessage *)local_e8);
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        }
      }
      ppFVar6 = ppFVar6 + 1;
    } while (ppFVar6 != local_108);
  }
  return;
}

Assistant:

void FilterFederate::runCloningDestinationFilters(const FilterCoordinator* fcoord,
                                                  const BasicHandleInfo* handle,
                                                  const ActionMessage& command) const
{
    mCoord.triggered = true;
    // now go to the cloning filters
    for (auto* clFilter : fcoord->cloningDestFilters) {
        if (checkActionFlag(*clFilter, disconnected_flag)) {
            continue;
        }
        if (clFilter->core_id == mFedID) {
            const auto* FiltI = getFilterInfo(mFedID, clFilter->handle);
            if (FiltI != nullptr) {
                if (FiltI->filterOp != nullptr) {
                    // this is a cloning filter so it generates a bunch(?) of new
                    // messages
                    auto new_messages =
                        FiltI->filterOp->processVector(createMessageFromCommand(command));
                    for (auto& msg : new_messages) {
                        if (msg) {
                            if (msg->dest == handle->key) {
                                // in case the clone filter send to itself.
                                ActionMessage cmd(std::move(msg));
                                cmd.dest_id = handle->handle.fed_id;
                                cmd.dest_handle = handle->handle.handle;
                                mSendMessageMove(std::move(cmd));
                            } else {
                                ActionMessage cmd(std::move(msg));
                                mDeliverMessage(cmd);
                            }
                        }
                    }
                }
            }
        } else {
            ActionMessage clone(command);
            clone.setAction(CMD_SEND_FOR_FILTER);
            clone.dest_id = clFilter->core_id;
            clone.dest_handle = clFilter->handle;
            mSendMessage(clone);
        }
    }
}